

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn)

{
  int iVar1;
  long lVar2;
  void *__s;
  LogEst LVar3;
  int iVar4;
  long lVar5;
  ushort in_CX;
  ulong in_RDX;
  WhereInfo *in_RSI;
  long *in_RDI;
  int *in_R8;
  ushort in_R9W;
  undefined4 *in_stack_00000008;
  int j;
  WhereTerm *pTerm_1;
  int iTerm;
  WhereTerm *pTerm;
  int nConstraint;
  SrcList_item *pSrc;
  Parse *pParse;
  WhereLoop *pNew;
  int rc;
  int mxTerm;
  int i;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_constraint *pIdxCons;
  WhereClause *pWC;
  undefined1 local_a0;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Table *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar6;
  Parse *pParse_00;
  WhereLoopBuilder *pBuilder_00;
  int local_58;
  int local_54;
  long local_48;
  int local_4;
  
  lVar2 = in_RDI[1];
  __s = *(void **)(in_R8 + 8);
  pBuilder_00 = (WhereLoopBuilder *)in_RDI[3];
  pParse_00 = *(Parse **)*in_RDI;
  lVar5 = *(long *)(*in_RDI + 8) + 8 + (ulong)*(byte *)&pBuilder_00->pOrderBy * 0x70;
  iVar6 = *in_R8;
  *in_stack_00000008 = 0;
  pBuilder_00->pWInfo = in_RSI;
  local_48 = *(long *)(in_R8 + 2);
  for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
    in_stack_ffffffffffffff78 =
         (Table *)(*(long *)(lVar2 + 0x20) + (long)*(int *)(local_48 + 8) * 0x40);
    *(undefined1 *)(local_48 + 5) = 0;
    if (((ExprList *)((ulong)in_stack_ffffffffffffff78->pCheck & in_RDX) ==
         in_stack_ffffffffffffff78->pCheck) &&
       ((*(ushort *)((long)&in_stack_ffffffffffffff78->pIndex + 4) & in_CX) == 0)) {
      *(undefined1 *)(local_48 + 5) = 1;
    }
    local_48 = local_48 + 0xc;
  }
  memset(__s,0,(long)iVar6 << 3);
  in_R8[0xc] = 0;
  in_R8[0xd] = 0;
  in_R8[10] = 0;
  in_R8[0xf] = 0;
  in_R8[0x10] = -0x5d7860d2;
  in_R8[0x11] = 0x546d42ae;
  in_R8[0x12] = 0x19;
  in_R8[0x13] = 0;
  in_R8[0x14] = 0;
  *(undefined8 *)(in_R8 + 0x16) = *(undefined8 *)(lVar5 + 0x58);
  local_4 = vtabBestIndex((Parse *)CONCAT44(iVar6,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78,
                          (sqlite3_index_info *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (local_4 == 0) {
    local_58 = -1;
    for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
      *(undefined8 *)((long)(pBuilder_00[1].pWC)->aStatic + (long)local_54 * 8 + -0x28) = 0;
    }
    *(undefined2 *)((long)&pBuilder_00->pNew + 6) = 0;
    local_48 = *(long *)(in_R8 + 2);
    for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
      iVar4 = *(int *)((long)__s + (long)local_54 * 8) + -1;
      if (-1 < iVar4) {
        iVar1 = *(int *)(local_48 + 8);
        if ((((iVar6 <= iVar4) || (iVar1 < 0)) || (*(int *)(lVar2 + 0x14) <= iVar1)) ||
           ((*(long *)((long)(pBuilder_00[1].pWC)->aStatic + (long)iVar4 * 8 + -0x28) != 0 ||
            (*(char *)(local_48 + 5) == '\0')))) {
          sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",**(undefined8 **)(lVar5 + 0x20));
          return 1;
        }
        in_stack_ffffffffffffff68 = (double)(*(long *)(lVar2 + 0x20) + (long)iVar1 * 0x40);
        pBuilder_00->pWInfo =
             (WhereInfo *)
             (*(ulong *)((long)in_stack_ffffffffffffff68 + 0x30) | (ulong)pBuilder_00->pWInfo);
        *(double *)((long)(pBuilder_00[1].pWC)->aStatic + (long)iVar4 * 8 + -0x28) =
             in_stack_ffffffffffffff68;
        if (local_58 < iVar4) {
          local_58 = iVar4;
        }
        if ((iVar4 < 0x10) && (*(char *)((long)__s + (long)local_54 * 8 + 4) != '\0')) {
          *(ushort *)((long)&pBuilder_00->pNew + 6) =
               *(ushort *)((long)&pBuilder_00->pNew + 6) | (ushort)(1 << ((byte)iVar4 & 0x1f));
        }
        if ((*(ushort *)((long)in_stack_ffffffffffffff68 + 0x14) & 1) != 0) {
          in_R8[0xf] = 0;
          in_R8[0x14] = in_R8[0x14] & 0xfffffffe;
          *in_stack_00000008 = 1;
        }
      }
      local_48 = local_48 + 0xc;
    }
    *(ushort *)((long)&pBuilder_00->pNew + 6) =
         *(ushort *)((long)&pBuilder_00->pNew + 6) & (in_R9W ^ 0xffff);
    *(short *)&pBuilder_00->iPlanLimit = (short)local_58 + 1;
    for (local_54 = 0; local_54 <= local_58; local_54 = local_54 + 1) {
      if (*(long *)((long)(pBuilder_00[1].pWC)->aStatic + (long)local_54 * 8 + -0x28) == 0) {
        sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",**(undefined8 **)(lVar5 + 0x20));
        return 1;
      }
    }
    *(int *)&pBuilder_00->pNew = in_R8[10];
    *(char *)((long)&pBuilder_00->pNew + 4) = (char)in_R8[0xe];
    in_R8[0xe] = 0;
    pBuilder_00->pOrSet = *(WhereOrSet **)(in_R8 + 0xc);
    if (in_R8[0xf] == 0) {
      local_a0 = 0;
    }
    else {
      local_a0 = (undefined1)in_R8[4];
    }
    *(undefined1 *)((long)&pBuilder_00->pNew + 5) = local_a0;
    *(undefined2 *)((long)&pBuilder_00->pOrderBy + 2) = 0;
    LVar3 = sqlite3LogEstFromDouble(in_stack_ffffffffffffff68);
    *(LogEst *)((long)&pBuilder_00->pOrderBy + 4) = LVar3;
    LVar3 = sqlite3LogEst(*(u64 *)(in_R8 + 0x12));
    *(LogEst *)((long)&pBuilder_00->pOrderBy + 6) = LVar3;
    if ((in_R8[0x14] & 1U) == 0) {
      pBuilder_00->bldFlags = pBuilder_00->bldFlags & 0xffffefff;
    }
    else {
      pBuilder_00->bldFlags = pBuilder_00->bldFlags | 0x1000;
    }
    local_4 = whereLoopInsert(pBuilder_00,(WhereLoop *)pParse_00);
    if (*(char *)((long)&pBuilder_00->pNew + 4) != '\0') {
      sqlite3_free((void *)0x1c6370);
      *(undefined1 *)((long)&pBuilder_00->pNew + 4) = 0;
    }
  }
  else if (local_4 == 0x13) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn                       /* OUT: True if plan uses an IN(...) op */
){
  WhereClause *pWC = pBuilder->pWC;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  struct SrcList_item *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by 
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight 
     && (pTerm->eOperator & mExclude)==0
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  for(i=0; i<nConstraint; i++) pNew->aLTerm[i] = 0;
  pNew->u.vtab.omitMask = 0;
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( iTerm<16 && pUsage[i].omit ) pNew->u.vtab.omitMask |= 1<<iTerm;
      if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }
    }
  }
  pNew->u.vtab.omitMask &= ~mNoOmit;

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}